

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O0

iterator __thiscall
Common::
BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
::insert(BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,KeywordID *val
        )

{
  mapped_type mVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  reference this_00;
  iterator iVar9;
  iterator_base<Common::BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
  local_a8;
  value_type local_80;
  size_t id;
  size_t local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
  local_58;
  KeywordID *local_30;
  KeywordID *val_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
  *this_local;
  iterator result;
  
  local_30 = val;
  val_local = (KeywordID *)key;
  key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  sVar5 = findKey(this,key);
  sVar6 = size(this);
  if (sVar5 == sVar6) {
    sVar5 = findValue(this,local_30);
    sVar6 = size(this);
    if (sVar5 == sVar6) {
      iterator_base<Common::BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>
      ::iterator_base((iterator_base<Common::BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>
                       *)&this_local,this,0);
      bVar4 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->destroyable);
      if (!bVar4) {
        pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                           (&this->destroyable);
        vVar2 = *pvVar7;
        local_80 = vVar2;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->keymap,(key_type *)val_local);
        vVar3 = local_80;
        *pmVar8 = vVar2;
        pmVar8 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](&this->valmap,local_30);
        *pmVar8 = vVar3;
        std::make_pair<std::__cxx11::string_const&,ICM::Keyword::KeywordID_const&>
                  (&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_local,
                   local_30);
        this_00 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                  ::operator[](&this->data,local_80);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
        ::operator=(this_00,&local_a8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
        ::~pair(&local_a8);
        iterator_base<Common::BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>
        ::iterator_base(&local_b8,this,local_80);
        result.data = (BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
                       *)local_b8.count;
        this_local = local_b8.data;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
        return _this_local;
      }
      mVar1 = this->currcount;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->keymap,(key_type *)val_local);
      *pmVar8 = mVar1;
      mVar1 = this->currcount;
      pmVar8 = std::
               map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
               ::operator[](&this->valmap,local_30);
      *pmVar8 = mVar1;
      std::make_pair<std::__cxx11::string_const&,ICM::Keyword::KeywordID_const&>
                (&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_local,
                 local_30);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
      ::push_back(&this->data,&local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
      ::~pair(&local_58);
      iterator_base<Common::BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>
      ::iterator_base((iterator_base<Common::BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>
                       *)&id,this,this->currcount);
      result.data = (BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
                     *)local_70;
      this_local = (BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
                    *)id;
      this->currcount = this->currcount + 1;
      return _this_local;
    }
  }
  iVar9 = end(this);
  return iVar9;
}

Assistant:

iterator insert(const _KTy &key, const _VTy &val) {
		if (findKey(key) != size() || findValue(val) != size()) {
			return end();
		}

		iterator result(this);
		if (destroyable.empty()) {
			keymap[key] = currcount;
			valmap[val] = currcount;
			data.push_back(std::make_pair(key, val));
			result = iterator(this, currcount);
			currcount++;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			valmap[val] = id;
			data[id] = std::make_pair(key, val);
			result = iterator(this, id);
			destroyable.pop_front();
		}
		return result;
	}